

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXConverter::~FBXConverter(FBXConverter *this)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  FBXConverter *this_local;
  
  iVar1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->meshes);
  iVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->meshes);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,Assimp::FBX::Util::delete_fun<aiMesh>>
            (iVar1._M_current,iVar2._M_current);
  iVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->materials);
  iVar4 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->materials);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,Assimp::FBX::Util::delete_fun<aiMaterial>>
            (iVar3._M_current,iVar4._M_current);
  iVar5 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin(&this->animations);
  iVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::end(&this->animations);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,Assimp::FBX::Util::delete_fun<aiAnimation>>
            (iVar5._M_current,iVar6._M_current);
  iVar7 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(&this->lights);
  iVar8 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(&this->lights);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,Assimp::FBX::Util::delete_fun<aiLight>>
            (iVar7._M_current,iVar8._M_current);
  iVar9 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(&this->cameras);
  iVar10 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(&this->cameras);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,Assimp::FBX::Util::delete_fun<aiCamera>>
            (iVar9._M_current,iVar10._M_current);
  iVar11 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(&this->textures);
  iVar12 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(&this->textures);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,Assimp::FBX::Util::delete_fun<aiTexture>>
            (iVar11._M_current,iVar12._M_current);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map(&this->mNodeNames);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map(&this->node_anim_chain_bits);
  std::
  map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&this->meshes_converted);
  std::
  map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
  ::~map(&this->textures_converted);
  std::
  map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
  ::~map(&this->materials_converted);
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::~vector(&this->textures);
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::~vector(&this->cameras);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::~vector(&this->lights);
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~vector(&this->animations);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&this->materials);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->meshes);
  return;
}

Assistant:

FBXConverter::~FBXConverter() {
            std::for_each(meshes.begin(), meshes.end(), Util::delete_fun<aiMesh>());
            std::for_each(materials.begin(), materials.end(), Util::delete_fun<aiMaterial>());
            std::for_each(animations.begin(), animations.end(), Util::delete_fun<aiAnimation>());
            std::for_each(lights.begin(), lights.end(), Util::delete_fun<aiLight>());
            std::for_each(cameras.begin(), cameras.end(), Util::delete_fun<aiCamera>());
            std::for_each(textures.begin(), textures.end(), Util::delete_fun<aiTexture>());
        }